

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<ProjectBuilderSubDirs*>::emplace<ProjectBuilderSubDirs*&>
          (QPodArrayOps<ProjectBuilderSubDirs*> *this,qsizetype i,ProjectBuilderSubDirs **args)

{
  int *piVar1;
  long lVar2;
  ProjectBuilderSubDirs *pPVar3;
  ProjectBuilderSubDirs **ppPVar4;
  GrowthPosition where;
  
  piVar1 = *(int **)this;
  if ((piVar1 != (int *)0x0) && (*piVar1 < 2)) {
    lVar2 = *(long *)(this + 0x10);
    if ((lVar2 == i) &&
       (*(long *)(piVar1 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar1 + 0x1fU & 0xfffffffffffffff0)) >> 3) + i)) {
      *(ProjectBuilderSubDirs **)(*(long *)(this + 8) + i * 8) = *args;
      *(qsizetype *)(this + 0x10) = i + 1;
      return;
    }
    if ((i == 0) && (((long)piVar1 + 0x1fU & 0xfffffffffffffff0) != *(ulong *)(this + 8))) {
      *(ProjectBuilderSubDirs **)(*(ulong *)(this + 8) - 8) = *args;
      *(long *)(this + 8) = *(long *)(this + 8) + -8;
      *(long *)(this + 0x10) = lVar2 + 1;
      return;
    }
  }
  pPVar3 = *args;
  where = (GrowthPosition)(i == 0 && *(long *)(this + 0x10) != 0);
  QArrayDataPointer<ProjectBuilderSubDirs_*>::detachAndGrow
            ((QArrayDataPointer<ProjectBuilderSubDirs_*> *)this,where,1,
             (ProjectBuilderSubDirs ***)0x0,(QArrayDataPointer<ProjectBuilderSubDirs_*> *)0x0);
  ppPVar4 = QPodArrayOps<ProjectBuilderSubDirs_*>::createHole
                      ((QPodArrayOps<ProjectBuilderSubDirs_*> *)this,where,i,1);
  *ppPVar4 = pPVar3;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }